

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O0

void __thiscall CLIListener::on_error(CLIListener *this,Poll *p,int event)

{
  ostream *poVar1;
  int event_local;
  Poll *p_local;
  CLIListener *this_local;
  
  if ((event & 0x10U) == 0) {
    Subscriber::on_error(&this->super_Subscriber,p,event);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&(this->super_Subscriber).name);
    poVar1 = std::operator<<(poVar1,": Ignoring POLLHUP");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void CLIListener::on_error(Poll &p, int event) {
  if (event & POLLHUP) {
    std::cout << name << ": Ignoring POLLHUP" << std::endl;
    return;
  }
  Subscriber::on_error(p, event);
}